

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 TPMU_HA_Marshal(TPMU_HA *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  int iVar1;
  BYTE *pBVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  UINT16 UVar10;
  long lVar11;
  
  UVar10 = 0;
  switch(selector) {
  case 4:
    if (buffer == (BYTE **)0x0) {
      return 0x14;
    }
    if ((size != (INT32 *)0x0) && (iVar1 = *size, *size = iVar1 + -0x14, iVar1 < 0x14)) {
      return 0x14;
    }
    pBVar2 = *buffer;
    *(undefined4 *)(pBVar2 + 0x10) = *(undefined4 *)(source->sha1 + 0x10);
    uVar3 = *(undefined8 *)(source->sha1 + 8);
    *(undefined8 *)pBVar2 = *(undefined8 *)source;
    *(undefined8 *)(pBVar2 + 8) = uVar3;
    UVar10 = 0x14;
    lVar11 = 0x14;
    break;
  default:
    goto switchD_00104ca6_caseD_5;
  case 0xb:
    if (buffer == (BYTE **)0x0) {
      return 0x20;
    }
    if ((size != (INT32 *)0x0) && (iVar1 = *size, *size = iVar1 + -0x20, iVar1 < 0x20)) {
      return 0x20;
    }
    pBVar2 = *buffer;
    uVar3 = *(undefined8 *)source;
    uVar4 = *(undefined8 *)(source->sha1 + 8);
    uVar5 = *(undefined8 *)(source->sha1 + 0x18);
    *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)(source->sha1 + 0x10);
    *(undefined8 *)(pBVar2 + 0x18) = uVar5;
    *(undefined8 *)pBVar2 = uVar3;
    *(undefined8 *)(pBVar2 + 8) = uVar4;
    UVar10 = 0x20;
    lVar11 = 0x20;
    break;
  case 0xc:
    if (buffer == (BYTE **)0x0) {
      return 0x30;
    }
    if ((size != (INT32 *)0x0) && (iVar1 = *size, *size = iVar1 + -0x30, iVar1 < 0x30)) {
      return 0x30;
    }
    pBVar2 = *buffer;
    uVar3 = *(undefined8 *)source;
    uVar4 = *(undefined8 *)(source->sha1 + 8);
    uVar5 = *(undefined8 *)(source->sha1 + 0x10);
    uVar6 = *(undefined8 *)(source->sha1 + 0x18);
    uVar7 = *(undefined8 *)(source->sha1 + 0x28);
    *(undefined8 *)(pBVar2 + 0x20) = *(undefined8 *)(source->sha1 + 0x20);
    *(undefined8 *)(pBVar2 + 0x28) = uVar7;
    *(undefined8 *)(pBVar2 + 0x10) = uVar5;
    *(undefined8 *)(pBVar2 + 0x18) = uVar6;
    *(undefined8 *)pBVar2 = uVar3;
    *(undefined8 *)(pBVar2 + 8) = uVar4;
    UVar10 = 0x30;
    lVar11 = 0x30;
    break;
  case 0xd:
    if (buffer == (BYTE **)0x0) {
      return 0x40;
    }
    if ((size != (INT32 *)0x0) && (iVar1 = *size, *size = iVar1 + -0x40, iVar1 < 0x40)) {
      return 0x40;
    }
    pBVar2 = *buffer;
    uVar3 = *(undefined8 *)source;
    uVar4 = *(undefined8 *)(source->sha1 + 8);
    uVar5 = *(undefined8 *)(source->sha1 + 0x10);
    uVar6 = *(undefined8 *)(source->sha1 + 0x18);
    uVar7 = *(undefined8 *)(source->sha1 + 0x20);
    uVar8 = *(undefined8 *)(source->sha1 + 0x28);
    uVar9 = *(undefined8 *)(source->sha1 + 0x38);
    *(undefined8 *)(pBVar2 + 0x30) = *(undefined8 *)(source->sha1 + 0x30);
    *(undefined8 *)(pBVar2 + 0x38) = uVar9;
    *(undefined8 *)(pBVar2 + 0x20) = uVar7;
    *(undefined8 *)(pBVar2 + 0x28) = uVar8;
    *(undefined8 *)(pBVar2 + 0x10) = uVar5;
    *(undefined8 *)(pBVar2 + 0x18) = uVar6;
    *(undefined8 *)pBVar2 = uVar3;
    *(undefined8 *)(pBVar2 + 8) = uVar4;
    UVar10 = 0x40;
    lVar11 = 0x40;
  }
  *buffer = *buffer + lVar11;
switchD_00104ca6_caseD_5:
  return UVar10;
}

Assistant:

UINT16
TPMU_HA_Marshal(TPMU_HA *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_SHA1
        case TPM_ALG_SHA1:
            return BYTE_Array_Marshal((BYTE *)(source->sha1), buffer, size, (INT32)SHA1_DIGEST_SIZE);
#endif // ALG_SHA1
#if         ALG_SHA256
        case TPM_ALG_SHA256:
            return BYTE_Array_Marshal((BYTE *)(source->sha256), buffer, size, (INT32)SHA256_DIGEST_SIZE);
#endif // ALG_SHA256
#if         ALG_SHA384
        case TPM_ALG_SHA384:
            return BYTE_Array_Marshal((BYTE *)(source->sha384), buffer, size, (INT32)SHA384_DIGEST_SIZE);
#endif // ALG_SHA384
#if         ALG_SHA512
        case TPM_ALG_SHA512:
            return BYTE_Array_Marshal((BYTE *)(source->sha512), buffer, size, (INT32)SHA512_DIGEST_SIZE);
#endif // ALG_SHA512
#if         ALG_SM3_256
        case TPM_ALG_SM3_256:
            return BYTE_Array_Marshal((BYTE *)(source->sm3_256), buffer, size, (INT32)SM3_256_DIGEST_SIZE);
#endif // ALG_SM3_256
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}